

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall SAT::clearSeen(SAT *this)

{
  uint uVar1;
  int *piVar2;
  bool *pbVar3;
  uint i_1;
  uint i;
  ulong uVar4;
  
  uVar1 = (this->ivseen_toclear).sz;
  piVar2 = (this->ivseen_toclear).data;
  pbVar3 = (this->ivseen).data;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    pbVar3[(uint)piVar2[uVar4]] = false;
  }
  if (piVar2 != (int *)0x0) {
    (this->ivseen_toclear).sz = 0;
  }
  for (uVar4 = 0; uVar4 < (this->out_learnt).sz; uVar4 = uVar4 + 1) {
    (this->seen).data[(uint)((this->out_learnt).data[uVar4].x >> 1)] = '\0';
  }
  return;
}

Assistant:

void SAT::clearSeen() {
	for (unsigned int i = 0; i < ivseen_toclear.size(); i++) {
		ivseen[ivseen_toclear[i]] = false;
	}
	ivseen_toclear.clear();

	for (unsigned int i = 0; i < out_learnt.size(); i++) {
		seen[var(out_learnt[i])] = 0;  // ('seen[]' is now cleared)
	}
}